

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O2

void TransformColorInverse_SSE2(VP8LMultipliers *m,uint32_t *src,int num_pixels,uint32_t *dst)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [15];
  undefined1 auVar3 [16];
  int iVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar11 [16];
  
  auVar3 = _DAT_00122780;
  iVar4 = (char)m->green_to_red * 0x80000 + ((int)(char)m->green_to_blue & 0x1fffU) * 8;
  auVar7._4_4_ = iVar4;
  auVar7._0_4_ = iVar4;
  auVar7._8_4_ = iVar4;
  auVar7._12_4_ = iVar4;
  iVar4 = (int)(char)m->red_to_blue;
  auVar8._0_4_ = iVar4 << 0x13;
  auVar8._4_4_ = iVar4 << 0x13;
  auVar8._8_4_ = iVar4 << 0x13;
  auVar8._12_4_ = iVar4 << 0x13;
  lVar5 = 0;
  lVar6 = 0;
  while (lVar6 + 4 <= (long)num_pixels) {
    auVar1 = *(undefined1 (*) [16])(src + lVar6);
    auVar11 = pshuflw(in_XMM5,auVar1 & auVar3,0xa0);
    auVar11 = pshufhw(auVar11,auVar11,0xa0);
    auVar11 = pmulhw(auVar11,auVar7);
    auVar9[0] = auVar11[0] + auVar1[0];
    auVar9[1] = auVar11[1] + auVar1[1];
    auVar9[2] = auVar11[2] + auVar1[2];
    auVar9[3] = auVar11[3] + auVar1[3];
    auVar9[4] = auVar11[4] + auVar1[4];
    auVar9[5] = auVar11[5] + auVar1[5];
    auVar9[6] = auVar11[6] + auVar1[6];
    auVar9[7] = auVar11[7] + auVar1[7];
    auVar9[8] = auVar11[8] + auVar1[8];
    auVar9[9] = auVar11[9] + auVar1[9];
    auVar9[10] = auVar11[10] + auVar1[10];
    auVar9[0xb] = auVar11[0xb] + auVar1[0xb];
    auVar9[0xc] = auVar11[0xc] + auVar1[0xc];
    auVar9[0xd] = auVar11[0xd] + auVar1[0xd];
    auVar9[0xe] = auVar11[0xe] + auVar1[0xe];
    auVar9[0xf] = auVar11[0xf] + auVar1[0xf];
    in_XMM5 = psllw(auVar9,8);
    auVar9 = pmulhw(in_XMM5,auVar8);
    auVar11._4_4_ = auVar9._12_4_ >> 8;
    auVar11._0_4_ = auVar9._8_4_ >> 8;
    auVar11._8_8_ = 0;
    auVar2._1_14_ = SUB1614(auVar11 << 0x40,2);
    auVar2[0] = auVar9[2] + in_XMM5[1];
    auVar10._2_2_ = (ushort)(((uint)in_XMM5[3] << 0x18) >> 0x18);
    auVar10._0_2_ = auVar2._0_2_;
    auVar10._4_2_ = (ushort)(((uint6)(byte)(auVar9[6] + in_XMM5[5]) << 0x28) >> 0x28);
    auVar10._6_2_ = (ushort)(((ulong)in_XMM5[7] << 0x38) >> 0x38);
    auVar10._8_2_ = (ushort)((uint3)((uint3)(byte)(auVar9[10] + in_XMM5[9]) << 0x10) >> 0x10);
    auVar10._10_2_ = (ushort)(((uint5)in_XMM5[0xb] << 0x20) >> 0x20);
    auVar10._12_2_ = (ushort)(((uint7)(byte)(auVar9[0xe] + in_XMM5[0xd]) << 0x30) >> 0x30);
    auVar10._14_2_ = (ushort)((uint3)((uint3)in_XMM5[0xf] << 0x10) >> 0x10);
    *(undefined1 (*) [16])(dst + lVar6) = auVar10 | auVar1 & auVar3;
    lVar5 = lVar5 + -0x10;
    lVar6 = lVar6 + 4;
  }
  if (num_pixels == (int)lVar6) {
    return;
  }
  VP8LTransformColorInverse_C
            (m,(uint32_t *)((long)src - lVar5),num_pixels - (int)lVar6,
             (uint32_t *)((long)dst - lVar5));
  return;
}

Assistant:

static void TransformColorInverse_SSE2(const VP8LMultipliers* const m,
                                       const uint32_t* const src,
                                       int num_pixels, uint32_t* dst) {
// sign-extended multiplying constants, pre-shifted by 5.
#define CST(X)  (((int16_t)(m->X << 8)) >> 5)   // sign-extend
#define MK_CST_16(HI, LO) \
  _mm_set1_epi32((int)(((uint32_t)(HI) << 16) | ((LO) & 0xffff)))
  const __m128i mults_rb = MK_CST_16(CST(green_to_red), CST(green_to_blue));
  const __m128i mults_b2 = MK_CST_16(CST(red_to_blue), 0);
#undef MK_CST_16
#undef CST
  const __m128i mask_ag = _mm_set1_epi32((int)0xff00ff00);  // alpha-green masks
  int i;
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i in = _mm_loadu_si128((const __m128i*)&src[i]); // argb
    const __m128i A = _mm_and_si128(in, mask_ag);     // a   0   g   0
    const __m128i B = _mm_shufflelo_epi16(A, _MM_SHUFFLE(2, 2, 0, 0));
    const __m128i C = _mm_shufflehi_epi16(B, _MM_SHUFFLE(2, 2, 0, 0));  // g0g0
    const __m128i D = _mm_mulhi_epi16(C, mults_rb);    // x dr  x db1
    const __m128i E = _mm_add_epi8(in, D);             // x r'  x   b'
    const __m128i F = _mm_slli_epi16(E, 8);            // r' 0   b' 0
    const __m128i G = _mm_mulhi_epi16(F, mults_b2);    // x db2  0  0
    const __m128i H = _mm_srli_epi32(G, 8);            // 0  x db2  0
    const __m128i I = _mm_add_epi8(H, F);              // r' x  b'' 0
    const __m128i J = _mm_srli_epi16(I, 8);            // 0  r'  0  b''
    const __m128i out = _mm_or_si128(J, A);
    _mm_storeu_si128((__m128i*)&dst[i], out);
  }
  // Fall-back to C-version for left-overs.
  if (i != num_pixels) {
    VP8LTransformColorInverse_C(m, src + i, num_pixels - i, dst + i);
  }
}